

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O3

void __thiscall cmComputeLinkDepends::FollowLinkEntry(cmComputeLinkDepends *this,BFSEntry *qe)

{
  int depender_index;
  TargetType TVar1;
  pointer pLVar2;
  cmTarget *this_00;
  LinkInterface *iface;
  pointer pcVar3;
  cmTarget **__v;
  pointer pcVar4;
  
  depender_index = qe->Index;
  pLVar2 = (this->EntryList).
           super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = pLVar2[depender_index].Target;
  if (this_00 != (cmTarget *)0x0) {
    iface = cmTarget::GetLinkInterface(this_00,&this->Config,this->Target);
    if (iface != (LinkInterface *)0x0) {
      TVar1 = (pLVar2[depender_index].Target)->TargetTypeValue;
      AddLinkEntries<cmLinkItem>
                (this,depender_index,(vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)iface);
      if (TVar1 != INTERFACE_LIBRARY) {
        FollowSharedDeps(this,depender_index,iface,false);
        pcVar4 = (iface->WrongConfigLibraries).
                 super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar3 = (iface->WrongConfigLibraries).
                 super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (pcVar4 != pcVar3) {
          __v = &pcVar4->Target;
          do {
            if (((this->OldLinkDirMode == true) && (*__v != (cmTarget *)0x0)) &&
               ((*__v)->IsImportedTarget == false)) {
              std::
              _Rb_tree<cmTarget_const*,cmTarget_const*,std::_Identity<cmTarget_const*>,std::less<cmTarget_const*>,std::allocator<cmTarget_const*>>
              ::_M_insert_unique<cmTarget_const*const&>
                        ((_Rb_tree<cmTarget_const*,cmTarget_const*,std::_Identity<cmTarget_const*>,std::less<cmTarget_const*>,std::allocator<cmTarget_const*>>
                          *)&this->OldWrongConfigItems,__v);
              pcVar3 = (iface->WrongConfigLibraries).
                       super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            }
            pcVar4 = (pointer)(__v + 1);
            __v = __v + 5;
          } while (pcVar4 != pcVar3);
        }
      }
    }
    return;
  }
  AddVarLinkEntries(this,depender_index,qe->LibDepends);
  return;
}

Assistant:

void cmComputeLinkDepends::FollowLinkEntry(BFSEntry const& qe)
{
  // Get this entry representation.
  int depender_index = qe.Index;
  LinkEntry const& entry = this->EntryList[depender_index];

  // Follow the item's dependencies.
  if(entry.Target)
    {
    // Follow the target dependencies.
    if(cmTarget::LinkInterface const* iface =
       entry.Target->GetLinkInterface(this->Config, this->Target))
      {
      const bool isIface =
                      entry.Target->GetType() == cmTarget::INTERFACE_LIBRARY;
      // This target provides its own link interface information.
      this->AddLinkEntries(depender_index, iface->Libraries);

      if (isIface)
        {
        return;
        }

      // Handle dependent shared libraries.
      this->FollowSharedDeps(depender_index, iface);

      // Support for CMP0003.
      for(std::vector<cmLinkItem>::const_iterator
            oi = iface->WrongConfigLibraries.begin();
          oi != iface->WrongConfigLibraries.end(); ++oi)
        {
        this->CheckWrongConfigItem(*oi);
        }
      }
    }
  else
    {
    // Follow the old-style dependency list.
    this->AddVarLinkEntries(depender_index, qe.LibDepends);
    }
}